

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
~TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                *this,void **vtt)

{
  TPZVec<int> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI->_vptr_TPZVec;
  TPZVec<int>::~TPZVec(in_RSI);
  TPZVec<int>::~TPZVec(in_RSI);
  TPZFrontNonSym<long_double>::~TPZFrontNonSym((TPZFrontNonSym<long_double> *)0x1ce8016);
  TPZStackEqnStorage<long_double>::~TPZStackEqnStorage((TPZStackEqnStorage<long_double> *)0x1ce8024)
  ;
  TPZAbstractFrontMatrix<long_double>::~TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<long_double> *)in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}